

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O3

uint GetStorageIndex(InstructionVMEvalContext *ctx,Storage *storage)

{
  uint uVar1;
  Storage **ppSVar2;
  uint uVar3;
  
  uVar3 = storage->index;
  if (uVar3 == 0) {
    uVar3 = (ctx->storageSet).count;
    if (uVar3 == (ctx->storageSet).max) {
      SmallArray<InstructionVMEvalContext::Storage_*,_32U>::grow(&ctx->storageSet,uVar3);
    }
    ppSVar2 = (ctx->storageSet).data;
    if (ppSVar2 == (Storage **)0x0) {
      __assert_fail("data",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x162,
                    "void SmallArray<InstructionVMEvalContext::Storage *, 32>::push_back(const T &) [T = InstructionVMEvalContext::Storage *, N = 32]"
                   );
    }
    uVar1 = (ctx->storageSet).count;
    uVar3 = uVar1 + 1;
    (ctx->storageSet).count = uVar3;
    ppSVar2[uVar1] = storage;
    storage->index = uVar3;
  }
  return uVar3;
}

Assistant:

unsigned GetStorageIndex(InstructionVMEvalContext &ctx, InstructionVMEvalContext::Storage *storage)
{
	if(storage->index != 0)
		return storage->index;

	ctx.storageSet.push_back(storage);
	storage->index = ctx.storageSet.size();

	return storage->index;
}